

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

size_t __thiscall rcg::Buffer::getSize(Buffer *this,uint32_t part)

{
  bool bVar1;
  element_type *peVar2;
  BUFFER_HANDLE pvVar3;
  GC_ERROR GVar4;
  void *pvVar5;
  size_t sVar6;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  size_t local_30 [2];
  INFO_DATATYPE local_1c;
  
  bVar1 = this->multipart;
  pvVar5 = Stream::getHandle(this->parent);
  peVar2 = (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pvVar3 = this->buffer;
  if (bVar1 == true) {
    local_30[0] = 0;
    local_30[1] = 8;
    if (pvVar3 == (BUFFER_HANDLE)0x0 || pvVar5 == (void *)0x0) {
      local_30[0] = 0;
    }
    else {
      (*peVar2->DSGetBufferPartInfo)(pvVar5,pvVar3,part,1,&local_1c,local_30,local_30 + 1);
    }
  }
  else {
    local_30[0] = 0;
    local_30[1] = 8;
    if ((pvVar3 == (BUFFER_HANDLE)0x0 || pvVar5 == (void *)0x0) ||
       (GVar4 = (*peVar2->DSGetBufferInfo)(pvVar5,pvVar3,1,&local_1c,local_30,local_30 + 1),
       sVar6 = local_30[0], GVar4 != 0)) {
      sVar6 = 0;
    }
    pvVar5 = Stream::getHandle(this->parent);
    local_30[0] = 0;
    local_30[1] = 8;
    if ((this->buffer == (BUFFER_HANDLE)0x0 || pvVar5 == (void *)0x0) ||
       (GVar4 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSGetBufferInfo)(pvVar5,this->buffer,0x12,&local_1c,local_30,local_30 + 1),
       GVar4 != 0)) {
      local_30[0] = 0;
    }
    local_30[0] = sVar6 - local_30[0];
  }
  return local_30[0];
}

Assistant:

size_t Buffer::getSize(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_DATA_SIZE);
  }
  else
  {
    size_t size=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                       GenTL::BUFFER_INFO_SIZE);

    size_t offset=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                         GenTL::BUFFER_INFO_IMAGEOFFSET);

    return size-offset;
  }
}